

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O3

XMLSize_t xercesc_4_0::XMLString::replaceTokens
                    (XMLCh *errText,XMLSize_t maxChars,XMLCh *text1,XMLCh *text2,XMLCh *text3,
                    XMLCh *text4,MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLCh XVar3;
  XMLCh *pXVar4;
  ulong uVar5;
  size_t __n;
  ArrayJanitor<char16_t> janText;
  ArrayJanitor<char16_t> local_40;
  char16_t *toDelete;
  
  if (errText == (XMLCh *)0x0) {
    toDelete = (char16_t *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)errText + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    toDelete = (char16_t *)CONCAT44(extraout_var,iVar2);
    memcpy(toDelete,errText,__n);
  }
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,manager);
  XVar3 = *toDelete;
  uVar5 = 0;
  if (maxChars == 0 || XVar3 == L'\0') {
LAB_0024f6bb:
    errText[uVar5] = L'\0';
    ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
    return uVar5;
  }
LAB_0024f600:
  do {
    if (XVar3 != L'{') {
      if (XVar3 == L'\0') goto LAB_0024f6bb;
      errText[uVar5] = XVar3;
      uVar5 = uVar5 + 1;
      XVar3 = toDelete[1];
      toDelete = toDelete + 1;
      if (uVar5 < maxChars) goto LAB_0024f600;
      if (XVar3 != L'{') goto LAB_0024f6bb;
    }
    XVar3 = toDelete[1];
    if (((XVar3 & 0xfffcU) == 0x30) && (toDelete[2] == L'}')) {
      pXVar4 = text1;
      if (((XVar3 != L'0') && (pXVar4 = text3, XVar3 != L'2')) && (pXVar4 = text2, XVar3 != L'1')) {
        pXVar4 = text4;
      }
      toDelete = toDelete + 3;
      if (pXVar4 == (XMLCh *)0x0) {
        pXVar4 = L"{null}";
      }
      XVar3 = *pXVar4;
      for (; (XVar3 != L'\0' && (uVar5 < maxChars)); uVar5 = uVar5 + 1) {
        pXVar4 = pXVar4 + 1;
        errText[uVar5] = XVar3;
        XVar3 = *pXVar4;
      }
    }
    else {
      toDelete = toDelete + 1;
      errText[uVar5] = L'{';
      uVar5 = uVar5 + 1;
    }
    XVar3 = *toDelete;
    if ((XVar3 == L'\0') || (maxChars <= uVar5)) goto LAB_0024f6bb;
  } while( true );
}

Assistant:

XMLSize_t XMLString::replaceTokens(          XMLCh* const    errText
                                        , const XMLSize_t       maxChars
                                        , const XMLCh* const    text1
                                        , const XMLCh* const    text2
                                        , const XMLCh* const    text3
                                        , const XMLCh* const    text4
                                        , MemoryManager* const  manager)
{
    //
    //  We have to build the string back into the source string, so allocate
    //  a temp string and copy the orignal text to it. We'll then treat the
    //  incoming buffer as a target buffer. Put a janitor on it to make sure
    //  it gets cleaned up.
    //
    XMLCh* orgText = replicate(errText, manager);
    ArrayJanitor<XMLCh> janText(orgText, manager);

    XMLCh* pszSrc = orgText;
    XMLSize_t curOutInd = 0;

    while (*pszSrc && (curOutInd < maxChars))
    {
        //
        //  Loop until we see a { character. Until we do, just copy chars
        //  from src to target, being sure not to overrun the output buffer.
        //
        while ((*pszSrc != chOpenCurly) && (curOutInd < maxChars))
        {
            if (!*pszSrc)
                break;
            errText[curOutInd++] = *pszSrc++;
        }

        // If we did not find a curly, then we are done
        if (*pszSrc != chOpenCurly)
            break;

        //
        //  Probe this one to see if it matches our pattern of {x}. If not
        //  then copy over those chars and go back to the first loop.
        //
        if ((*(pszSrc+1) >= chDigit_0)
        &&  (*(pszSrc+1) <= chDigit_3)
        &&  (*(pszSrc+2) == chCloseCurly))
        {
            //
            //  Its one of our guys, so move the source pointer up past the
            //  token we are replacing. First though get out the token number
            //  character.
            //
            XMLCh tokCh = *(pszSrc+1);
            pszSrc += 3;

            // Now copy over the replacement text
            const XMLCh* repText = 0;
            if (tokCh == chDigit_0)
                repText = text1;
            else if (tokCh == chDigit_1)
                repText = text2;
            else if (tokCh == chDigit_2)
                repText = text3;
            else if (tokCh == chDigit_3)
                repText = text4;

            // If this one is null, copy over a null string
            if (!repText)
                repText = gNullStr;

            while (*repText && (curOutInd < maxChars))
                errText[curOutInd++] = *repText++;
        }
         else
        {
            // Escape the curly brace character and continue
            errText[curOutInd++] = *pszSrc++;
        }
    }

    // Copy over a null terminator
    errText[curOutInd] = 0;

    // And return the count of chars we output
    return curOutInd;
}